

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

int helicsGetOptionValue(char *val)

{
  long in_RDI;
  undefined4 in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
              );
    local_4 = helics::getOptionValue(in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(local_4,in_stack_ffffffffffffffa0));
    std::allocator<char>::~allocator(&local_31);
  }
  return local_4;
}

Assistant:

int helicsGetOptionValue(const char* val)
{
    if (val == nullptr) {
        return -1;
    }
    return helics::getOptionValue(val);
}